

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.cc
# Opt level: O0

void __thiscall t_queue::f_push(t_queue *this,t_container *a_library,t_pvalue *a_value)

{
  anon_class_24_3_6943759f a_do;
  t_pvalue *a_value_local;
  t_container *a_library_local;
  t_queue *this_local;
  
  a_do.a_value = a_value;
  a_do.a_library = (t_container **)&a_value_local;
  a_do.this = this;
  a_value_local = (t_pvalue *)a_library;
  a_library_local = (t_container *)this;
  xemmai::t_sharable::
  f_owned_or_shared<xemmai::t_lock_with_safe_region,t_queue::f_push(t_container*,xemmai::t_value<xemmai::t_pointer>const&)::__0>
            (&this->super_t_sharable,a_do);
  return;
}

Assistant:

void t_queue::f_push(t_container* a_library, const t_pvalue& a_value)
{
	f_owned_or_shared<t_lock_with_safe_region>([&]
	{
		auto pair = t_type_of<t_pair>::f_instantiate(a_library, a_value);
		if (v_head) {
			pair->f_as<t_pair>().v_next = v_head->f_as<t_pair>().v_next;
			v_head->f_as<t_pair>().v_next = pair;
		} else {
			pair->f_as<t_pair>().v_next = pair;
		}
		v_head = pair;
	});
}